

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

size_t Assimp::WriteBounds<aiVectorKey>(IOStream *stream,aiVectorKey *in,uint size)

{
  size_t sVar1;
  size_t sVar2;
  aiVectorKey maxc;
  aiVectorKey minc;
  aiVectorKey local_58;
  aiVectorKey local_38;
  
  local_38.mTime = 0.0;
  local_38.mValue.x = 0.0;
  local_38.mValue.y = 0.0;
  local_38.mValue.z = 0.0;
  local_58.mTime = 0.0;
  local_58.mValue.x = 0.0;
  local_58.mValue.y = 0.0;
  local_58.mValue.z = 0.0;
  ArrayBounds<aiVectorKey>(in,size,&local_38,&local_58);
  sVar1 = Write<aiVectorKey>(stream,&local_38);
  sVar2 = Write<aiVectorKey>(stream,&local_58);
  return sVar2 + sVar1;
}

Assistant:

inline
size_t WriteBounds(IOStream * stream, const T* in, unsigned int size) {
    T minc, maxc;
    ArrayBounds(in,size,minc,maxc);

    const size_t t = Write<T>(stream,minc);
    return t + Write<T>(stream,maxc);
}